

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTRuntimeInfoTracker.cpp
# Opt level: O1

void __thiscall
TTD::RuntimeContextInfo::EnqueueNewPathVarAsNeeded
          (RuntimeContextInfo *this,RecyclableObject *parent,Var val,char16 *propName,
          char16 *optacessortag)

{
  BaseDictionary<Js::RecyclableObject_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  bool bVar1;
  HeapAllocator *this_01;
  TTAutoString *this_02;
  undefined **local_70;
  TTAutoString *tpath;
  size_t local_60;
  char *local_58;
  DWORD local_50;
  TTAutoString *local_48;
  RecyclableObject *local_40;
  RecyclableObject *parent_local;
  RecyclableObject *obj;
  
  local_40 = parent;
  bVar1 = JsSupport::IsVarTaggedInline(val);
  if (!bVar1) {
    bVar1 = JsSupport::IsVarPrimitiveKind(val);
    if ((!bVar1) || (((local_40->type).ptr)->typeId == TypeIds_GlobalObject)) {
      parent_local = Js::VarTo<Js::RecyclableObject>(val);
      this_00 = &this->m_coreObjToPathMap;
      bVar1 = JsUtil::
              BaseDictionary<Js::RecyclableObject_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::ContainsKey(this_00,&parent_local);
      if (!bVar1) {
        local_48 = JsUtil::
                   BaseDictionary<Js::RecyclableObject_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                   ::Item(this_00,&local_40);
        DListBase<Js::RecyclableObject_*,_RealCount>::Append<Memory::HeapAllocator>
                  ((DListBase<Js::RecyclableObject_*,_RealCount> *)this,
                   (this->m_worklist).list.allocator,&parent_local);
        local_70 = &UtilSupport::TTAutoString::typeinfo;
        tpath = (TTAutoString *)0x0;
        local_60 = 0xffffffffffffffff;
        local_58 = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/TTRuntimeInfoTracker.cpp"
        ;
        local_50 = 0x394;
        this_01 = Memory::HeapAllocator::TrackAllocInfo
                            (&Memory::HeapAllocator::Instance,
                             (TrackAllocData *)&stack0xffffffffffffff90);
        this_02 = (TTAutoString *)Memory::HeapAllocator::AllocT<true>(this_01,0x18);
        UtilSupport::TTAutoString::TTAutoString(this_02,local_48);
        local_70 = (undefined **)this_02;
        UtilSupport::TTAutoString::Append(this_02,L".",0,0xffffffffffffffff);
        UtilSupport::TTAutoString::Append((TTAutoString *)local_70,propName,0,0xffffffffffffffff);
        if (optacessortag != (char16 *)0x0) {
          UtilSupport::TTAutoString::Append
                    ((TTAutoString *)local_70,optacessortag,0,0xffffffffffffffff);
        }
        bVar1 = JsUtil::
                BaseDictionary<Js::RecyclableObject_*,_TTD::UtilSupport::TTAutoString_*,_Memory::HeapAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::ContainsKey(this_00,&parent_local);
        if (bVar1) {
          TTDAbort_unrecoverable_error("Already in map!!!");
        }
        JsUtil::
        BaseDictionary<Js::RecyclableObject*,TTD::UtilSupport::TTAutoString*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
        ::
        Insert<(JsUtil::BaseDictionary<Js::RecyclableObject*,TTD::UtilSupport::TTAutoString*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                  ((BaseDictionary<Js::RecyclableObject*,TTD::UtilSupport::TTAutoString*,Memory::HeapAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                    *)this_00,&parent_local,(TTAutoString **)&stack0xffffffffffffff90);
      }
    }
  }
  return;
}

Assistant:

void RuntimeContextInfo::EnqueueNewPathVarAsNeeded(Js::RecyclableObject* parent, Js::Var val, const char16* propName, const char16* optacessortag)
    {
        if(JsSupport::IsVarTaggedInline(val))
        {
            return;
        }

        if(JsSupport::IsVarPrimitiveKind(val) && !Js::VarIs<Js::GlobalObject>(parent))
        {
            return; //we keep primitives from global object only -- may need others but this is a simple way to start to get undefined, null, infy, etc.
        }

        Js::RecyclableObject* obj = Js::VarTo<Js::RecyclableObject>(val);
        if(!this->m_coreObjToPathMap.ContainsKey(obj))
        {
            const UtilSupport::TTAutoString* ppath = this->m_coreObjToPathMap.Item(parent);

            this->m_worklist.Enqueue(obj);

            UtilSupport::TTAutoString* tpath = TT_HEAP_NEW(UtilSupport::TTAutoString, *ppath);
            tpath->Append(_u("."));
            tpath->Append(propName);

            if(optacessortag != nullptr)
            {
                tpath->Append(optacessortag);
            }

            TTDAssert(!this->m_coreObjToPathMap.ContainsKey(obj), "Already in map!!!");
            this->m_coreObjToPathMap.AddNew(obj, tpath);
        }
    }